

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

double __thiscall
soplex::SPxBasisBase<double>::condition(SPxBasisBase<double> *this,int maxiters,double tolerance)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  SSVectorBase<double> x;
  SSVectorBase<double> y;
  double local_110;
  double local_f8;
  SSVectorBase<double> local_f0;
  shared_ptr<soplex::Tolerances> local_a0;
  shared_ptr<soplex::Tolerances> local_90;
  SSVectorBase<double> local_80;
  
  uVar2 = (this->matrix).thesize;
  if ((int)uVar2 < 1) {
    dVar6 = 1.0;
  }
  else {
    local_90.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->theLP->super_SPxLPBase<double>)._tolerances.
         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_90.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->theLP->super_SPxLPBase<double>)._tolerances.
         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_90.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_90.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_90.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_90.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_90.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SSVectorBase<double>::SSVectorBase(&local_f0,uVar2,&local_90);
    if (local_90.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->theLP->super_SPxLPBase<double>)._tolerances.
         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->theLP->super_SPxLPBase<double>)._tolerances.
         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SSVectorBase<double>::SSVectorBase(&local_80,uVar2,&local_a0);
    if (local_a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (this->thestatus < REGULAR) {
      dVar6 = 0.0;
    }
    else {
      if (this->matrixIsSetup == false) {
        (*this->_vptr_SPxBasisBase[5])(this);
      }
      if (this->factorized == false) {
        (*this->_vptr_SPxBasisBase[0xb])(this);
      }
      dVar8 = 1.0 / (double)(int)uVar2;
      uVar1 = 1;
      if (1 < (int)uVar2) {
        uVar1 = (ulong)uVar2;
      }
      uVar3 = 0;
      do {
        lVar4 = (long)local_f0.super_IdxSet.num;
        local_f0.super_IdxSet.num = local_f0.super_IdxSet.num + 1;
        local_f0.super_IdxSet.idx[lVar4] = (int)uVar3;
        local_f0.super_VectorBase<double>.val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar3] = dVar8;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      SSVectorBase<double>::operator=(&local_80,&local_f0);
      dVar6 = dVar8;
      if (0 < maxiters) {
        uVar5 = 0;
        local_f8 = dVar8;
        do {
          multBaseWith(this,&local_f0,&local_80);
          dVar6 = SSVectorBase<double>::length2(&local_80);
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          if ((2 < uVar5) && (ABS(dVar6 - local_f8) < dVar6 * tolerance)) break;
          multWithBase(this,&local_80,&local_f0);
          dVar7 = SSVectorBase<double>::length2(&local_f0);
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          if (0 < (long)local_f0.super_IdxSet.num) {
            lVar4 = (long)local_f0.super_IdxSet.num + 1;
            do {
              local_f0.super_VectorBase<double>.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[local_f0.super_IdxSet.idx[lVar4 + -2]] =
                   local_f0.super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[local_f0.super_IdxSet.idx[lVar4 + -2]] *
                   (1.0 / dVar7);
              lVar4 = lVar4 + -1;
            } while (1 < lVar4);
          }
          uVar5 = uVar5 + 1;
          local_f8 = dVar6;
        } while (uVar5 != maxiters);
      }
      if (local_f0.setupStatus == true) {
        if (0 < (long)local_f0.super_IdxSet.num) {
          lVar4 = 0;
          do {
            local_f0.super_VectorBase<double>.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[local_f0.super_IdxSet.idx[lVar4]] = 0.0;
            lVar4 = lVar4 + 1;
          } while (local_f0.super_IdxSet.num != lVar4);
        }
      }
      else if (local_f0.super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start !=
               local_f0.super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish) {
        memset(local_f0.super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,0,
               (long)local_f0.super_VectorBase<double>.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f0.super_VectorBase<double>.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start & 0xfffffffffffffff8);
      }
      local_f0.super_IdxSet.num = 0;
      local_f0.setupStatus = true;
      if (local_80.setupStatus == true) {
        if (0 < (long)local_80.super_IdxSet.num) {
          lVar4 = 0;
          do {
            local_80.super_VectorBase<double>.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[local_80.super_IdxSet.idx[lVar4]] = 0.0;
            lVar4 = lVar4 + 1;
          } while (local_80.super_IdxSet.num != lVar4);
        }
      }
      else if (local_80.super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start !=
               local_80.super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish) {
        memset(local_80.super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,0,
               (long)local_80.super_VectorBase<double>.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_80.super_VectorBase<double>.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start & 0xfffffffffffffff8);
      }
      local_80.super_IdxSet.num = 0;
      local_80.setupStatus = true;
      uVar1 = 1;
      if (1 < (int)uVar2) {
        uVar1 = (ulong)uVar2;
      }
      uVar3 = 0;
      do {
        lVar4 = (long)local_f0.super_IdxSet.num;
        local_f0.super_IdxSet.num = local_f0.super_IdxSet.num + 1;
        local_f0.super_IdxSet.idx[lVar4] = (int)uVar3;
        local_f0.super_VectorBase<double>.val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar3] = dVar8;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      SSVectorBase<double>::operator=(&local_80,&local_f0);
      if (0 < maxiters) {
        uVar2 = 0;
        local_110 = dVar8;
        do {
          (*this->factor->_vptr_SLinSolver[0xd])(this->factor,&local_f0,&local_80);
          SSVectorBase<double>::setup(&local_f0);
          dVar8 = SSVectorBase<double>::length2(&local_f0);
          if (dVar8 < 0.0) {
            dVar8 = sqrt(dVar8);
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          if ((2 < uVar2) && (ABS(dVar8 - local_110) < dVar8 * tolerance)) break;
          (*this->factor->_vptr_SLinSolver[0x15])(this->factor,&local_80,&local_f0);
          SSVectorBase<double>::setup(&local_80);
          dVar7 = SSVectorBase<double>::length2(&local_80);
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          if (0 < (long)local_80.super_IdxSet.num) {
            lVar4 = (long)local_80.super_IdxSet.num + 1;
            do {
              local_80.super_VectorBase<double>.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[local_80.super_IdxSet.idx[lVar4 + -2]] =
                   local_80.super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[local_80.super_IdxSet.idx[lVar4 + -2]] *
                   (1.0 / dVar7);
              lVar4 = lVar4 + -1;
            } while (1 < lVar4);
          }
          uVar2 = uVar2 + 1;
          local_110 = dVar8;
        } while (uVar2 != maxiters);
      }
      dVar6 = dVar6 * dVar8;
    }
    SSVectorBase<double>::~SSVectorBase(&local_80);
    SSVectorBase<double>::~SSVectorBase(&local_f0);
  }
  return dVar6;
}

Assistant:

R SPxBasisBase<R>::condition(int maxiters, R tolerance)
{
   int dimension = matrix.size();
   int miniters = 3;    // minimum number of power method iterations
   int i;
   int c;
   R norm;
   R norminv;
   R norm1;
   R norm2;

   // catch corner case of empty matrix
   if(dimension <= 0)
      return 1.0;

   SSVectorBase<R> x(dimension, theLP->tolerances());
   SSVectorBase<R> y(dimension, theLP->tolerances());

   // check whether a regular basis matrix is available
   if(status() < REGULAR)
      return 0;

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   if(!factorized)
      factorize();

   // initialize vectors
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
   {
      // coverity[forward_null]
      x.add(i, norm1);
   }

   y = x;

   // compute norm of B
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // y = B*x
      multBaseWith(x, y);
      norm1 = y.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // x = B^T*y and normalize
      multWithBase(y, x);
      norm2 = 1.0 / x.length();
      x *= norm2;
   }

   norm = norm1;

   // reinitialize vectors
   x.clear();
   y.clear();
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
      x.add(i, norm1);

   y = x;

   // compute norm of B^-1
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // x = B^-1*y
      factor->solveRight(x, y);
      x.setup();
      norm1 = x.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // y = B^-T*x and normalize
      factor->solveLeft(y, x);
      y.setup();
      norm2 = 1.0 / y.length();
      y *= norm2;
   }

   norminv = norm1;

   return norm * norminv;
}